

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exit_code.c
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  int iVar1;
  int iVar2;
  
  iVar2 = 1;
  if (1 < argc) {
    __s1 = argv[1];
    iVar1 = strcmp(__s1,"zero_exit");
    if (iVar1 == 0) {
      iVar2 = 0;
    }
    else {
      iVar1 = strcmp(__s1,"non_zero_exit");
      if (iVar1 != 0) {
        fprintf(_stderr,"Failed to find string \'%s\' in \'%s\'\n","zero_exit",__s1);
      }
    }
  }
  return iVar2;
}

Assistant:

int main(int argc, const char* argv[])
{
  const char* substring_failure = "non_zero_exit";
  const char* substring_success = "zero_exit";
  const char* str = argv[1];
  if (argc < 2) {
    return EXIT_FAILURE;
  }
  if (strcmp(str, substring_success) == 0) {
    return EXIT_SUCCESS;
  }
  if (strcmp(str, substring_failure) == 0) {
    return EXIT_FAILURE;
  }
  fprintf(stderr, "Failed to find string '%s' in '%s'\n", substring_success,
          str);
  return EXIT_FAILURE;
}